

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::drawTessCoordPoint
               (Surface *dst,TessPrimitiveType primitiveType,Vec3 *pt,RGBA *color,int size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int i_3;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  Vec2 dstPos;
  int height;
  Vector<float,_2> res_3;
  Vector<float,_2> res_1;
  Vector<float,_2> res;
  Vector<float,_2> res_2;
  float local_60 [4];
  float local_50 [8];
  
  if (Functional::(anonymous_namespace)::
      drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
      ::triangleCorners == '\0') {
    _GLOBAL__N_1::drawTessCoordPoint();
  }
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    fVar1 = pt->m_data[0];
    local_50[4] = 0.0;
    local_50[5] = 0.0;
    lVar5 = 0;
    do {
      *(float *)((long)local_50 + lVar5 + 0x10) =
           *(float *)((long)drawTessCoordPoint::triangleCorners[0].m_data + lVar5) * fVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    fVar1 = pt->m_data[1];
    local_50[2] = 0.0;
    local_50[3] = 0.0;
    lVar5 = 0;
    do {
      local_50[lVar5 + 2] = drawTessCoordPoint::triangleCorners[1].m_data[lVar5] * fVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    local_50[6] = 0.0;
    local_50[7] = 0.0;
    lVar5 = 0;
    do {
      local_50[lVar5 + 6] = local_50[lVar5 + 4] + local_50[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    fVar1 = pt->m_data[2];
    local_50[0] = 0.0;
    local_50[1] = 0.0;
    lVar5 = 0;
    do {
      local_50[lVar5] = drawTessCoordPoint::triangleCorners[2].m_data[lVar5] * fVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    local_60[0] = 0.0;
    local_60[1] = 0.0;
    lVar5 = 0;
    do {
      local_60[lVar5] = local_50[lVar5 + 6] + local_50[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
  }
  else if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    local_60[1] = (1.0 - pt->m_data[1]) * 0.9 + pt->m_data[1] * 0.1;
    local_60[0] = (1.0 - pt->m_data[0]) * 0.1 + pt->m_data[0] * 0.9;
  }
  else {
    lVar5 = 0;
    do {
      local_60[lVar5] = -1.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
  }
  iVar2 = dst->m_width;
  iVar3 = dst->m_height;
  iVar7 = (int)((float)iVar3 * local_60[1]);
  uVar9 = size - 1U >> 1;
  iVar8 = iVar7 - uVar9;
  uVar10 = -uVar9;
  do {
    iVar11 = uVar10 + iVar7;
    pvVar4 = (dst->m_pixels).m_ptr;
    iVar6 = (int)((float)iVar2 * local_60[0]) - uVar9;
    iVar12 = ((uint)size >> 1) + uVar9 + 1;
    do {
      if ((iVar6 < iVar2 && -1 < iVar6) && (iVar11 < iVar3 && -1 < iVar11)) {
        *(deUint32 *)((long)pvVar4 + (long)(dst->m_width * iVar8 + iVar6) * 4) = color->m_value;
      }
      iVar6 = iVar6 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    iVar8 = iVar8 + 1;
    bVar13 = uVar10 != (uint)size >> 1;
    uVar10 = uVar10 + 1;
  } while (bVar13);
  return;
}

Assistant:

static void drawTessCoordPoint (tcu::Surface& dst, TessPrimitiveType primitiveType, const Vec3& pt, const tcu::RGBA& color, int size)
{
	// \note These coordinates should match the description in the log message in TessCoordCase::iterate.

	static const Vec2 triangleCorners[3] =
	{
		Vec2(0.95f, 0.95f),
		Vec2(0.5f,  0.95f - 0.9f*deFloatSqrt(3.0f/4.0f)),
		Vec2(0.05f, 0.95f)
	};

	static const float quadIsolineLDRU[4] =
	{
		0.1f, 0.9f, 0.9f, 0.1f
	};

	const Vec2 dstPos = primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? pt.x()*triangleCorners[0]
																	 + pt.y()*triangleCorners[1]
																	 + pt.z()*triangleCorners[2]

					  : primitiveType == TESSPRIMITIVETYPE_QUADS ||
						primitiveType == TESSPRIMITIVETYPE_ISOLINES ? Vec2((1.0f - pt.x())*quadIsolineLDRU[0] + pt.x()*quadIsolineLDRU[2],
																		   (1.0f - pt.y())*quadIsolineLDRU[1] + pt.y()*quadIsolineLDRU[3])

					  : Vec2(-1.0f);

	drawPoint(dst, (int)(dstPos.x() * (float)dst.getWidth()), (int)(dstPos.y() * (float)dst.getHeight()), color, size);
}